

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

void __thiscall chaiscript::exception::eval_error::~eval_error(eval_error *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__eval_error_005a0cf8;
  Catch::clara::std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
  ::~vector(&this->call_stack);
  pcVar2 = (this->detail)._M_dataplus._M_p;
  paVar1 = &(this->detail).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->filename)._M_dataplus._M_p;
  paVar1 = &(this->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->reason)._M_dataplus._M_p;
  paVar1 = &(this->reason).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::runtime_error::~runtime_error((runtime_error *)this);
  return;
}

Assistant:

~eval_error() noexcept override = default;